

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

PacketList * __thiscall
ASDCP::MXF::Partition::PacketList::GetMDObjectsByType
          (PacketList *this,byte_t *ObjectID,
          list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
          *ObjectList)

{
  char cVar1;
  _List_node_base *in_RCX;
  undefined1 *puVar2;
  long *plVar3;
  
  plVar3 = (long *)ObjectID;
  if (ObjectList ==
      (list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_> *)0x0
     ) {
    puVar2 = Kumu::RESULT_PTR;
  }
  else {
    while (plVar3 = (long *)*plVar3, plVar3 != (long *)ObjectID) {
      cVar1 = (**(code **)(*(long *)plVar3[2] + 0x20))((long *)plVar3[2],ObjectList);
      if (cVar1 != '\0') {
        std::__cxx11::
        list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
        push_back((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                   *)in_RCX,(value_type *)(plVar3 + 2));
      }
    }
    puVar2 = (undefined1 *)&Kumu::RESULT_OK;
    if ((((_List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
           *)&in_RCX->_M_next)->_M_impl)._M_node.super__List_node_base._M_next == in_RCX) {
      puVar2 = Kumu::RESULT_FAIL;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar2);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Partition::PacketList::GetMDObjectsByType(const byte_t* ObjectID, std::list<InterchangeObject*>& ObjectList)
{
  ASDCP_TEST_NULL(ObjectID);
  std::list<InterchangeObject*>::iterator li;

  for ( li = m_List.begin(); li != m_List.end(); li++ )
    {
      if ( (*li)->HasUL(ObjectID) )
	ObjectList.push_back(*li);
    }

  return ObjectList.empty() ? RESULT_FAIL : RESULT_OK;
}